

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_disp_matrix_orient(char *mesg,mat44 mat)

{
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int local_24;
  int local_20;
  int k;
  int j;
  int i;
  char *mesg_local;
  
  _j = mesg;
  if (mesg != (char *)0x0) {
    fputs(mesg,_stderr);
  }
  nifti_mat44_to_orientation(mat,&k,&local_20,&local_24);
  __stream = _stderr;
  if (((k < 1) || (local_20 < 1)) || (local_24 < 1)) {
    mesg_local._4_4_ = -1;
  }
  else {
    pcVar1 = nifti_orientation_string(k);
    pcVar2 = nifti_orientation_string(local_20);
    pcVar3 = nifti_orientation_string(local_24);
    fprintf(__stream,
            "  i orientation = \'%s\'\n  j orientation = \'%s\'\n  k orientation = \'%s\'\n",pcVar1,
            pcVar2,pcVar3);
    mesg_local._4_4_ = 0;
  }
  return mesg_local._4_4_;
}

Assistant:

int nifti_disp_matrix_orient( const char * mesg, mat44 mat )
{
   int i, j, k;

   if ( mesg ) fputs( mesg, stderr );  /* use stdout? */

   nifti_mat44_to_orientation( mat, &i,&j,&k );
   if ( i <= 0 || j <= 0 || k <= 0 ) return -1;

   /* so we have good codes */
   fprintf(stderr, "  i orientation = '%s'\n"
                   "  j orientation = '%s'\n"
                   "  k orientation = '%s'\n",
                   nifti_orientation_string(i),
                   nifti_orientation_string(j),
                   nifti_orientation_string(k) );
   return 0;
}